

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

char * comm_bit_name(long *comm_flags)

{
  char *pcVar1;
  uint uVar2;
  size_t sVar3;
  ulong uVar4;
  
  comm_bit_name::buf[0] = '\0';
  uVar4 = *comm_flags;
  if ((uVar4 & 1) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," qui",4);
    builtin_strncpy(comm_bit_name::buf + sVar3 + 3,"iet",4);
    uVar4 = *comm_flags;
  }
  if ((uVar4 & 2) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," dea",4);
    (comm_bit_name::buf + sVar3 + 4)[0] = 'f';
    (comm_bit_name::buf + sVar3 + 4)[1] = '\0';
    uVar4 = *comm_flags;
  }
  if ((uVar4 & 4) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," no_wiz",8);
    uVar4 = *comm_flags;
  }
  if ((uVar4 & 8) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," no_auct",8);
    builtin_strncpy(comm_bit_name::buf + sVar3 + 8,"ion",4);
    uVar4 = *comm_flags;
  }
  if ((uVar4 & 0x10) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," no_goss",8);
    builtin_strncpy(comm_bit_name::buf + sVar3 + 7,"sip",4);
    uVar4 = *comm_flags;
  }
  if ((uVar4 & 0x20) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," no_ques",8);
    builtin_strncpy(comm_bit_name::buf + sVar3 + 5,"uestion",8);
    uVar4 = *comm_flags;
  }
  uVar2 = (uint)uVar4;
  if ((uVar4 & 0x40) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," no_newb",8);
    builtin_strncpy(comm_bit_name::buf + sVar3 + 7,"bie",4);
    uVar2 = (uint)*comm_flags;
  }
  if ((uVar2 >> 8 & 1) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," no_quot",8);
    (comm_bit_name::buf + sVar3 + 8)[0] = 'e';
    (comm_bit_name::buf + sVar3 + 8)[1] = '\0';
    uVar2 = (uint)*comm_flags;
  }
  if ((uVar2 >> 0xb & 1) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," compact",8);
    comm_bit_name::buf[sVar3 + 8] = '\0';
    uVar2 = (uint)*comm_flags;
  }
  if ((uVar2 >> 0xc & 1) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," bri",4);
    builtin_strncpy(comm_bit_name::buf + sVar3 + 3,"ief",4);
    uVar2 = (uint)*comm_flags;
  }
  if ((uVar2 >> 0xd & 1) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," prompt",8);
    uVar2 = (uint)*comm_flags;
  }
  if ((uVar2 >> 0xe & 1) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," combine",8);
    comm_bit_name::buf[sVar3 + 8] = '\0';
    uVar2 = (uint)*comm_flags;
  }
  if ((uVar2 >> 0x13 & 1) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," no_emot",8);
    (comm_bit_name::buf + sVar3 + 8)[0] = 'e';
    (comm_bit_name::buf + sVar3 + 8)[1] = '\0';
    uVar2 = (uint)*comm_flags;
  }
  if ((uVar2 >> 0x14 & 1) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," no_shou",8);
    (comm_bit_name::buf + sVar3 + 8)[0] = 't';
    (comm_bit_name::buf + sVar3 + 8)[1] = '\0';
    uVar2 = (uint)*comm_flags;
  }
  if ((uVar2 >> 0x15 & 1) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," no_tell",8);
    comm_bit_name::buf[sVar3 + 8] = '\0';
    uVar2 = (uint)*comm_flags;
  }
  if ((uVar2 >> 0x16 & 1) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," no_chan",8);
    builtin_strncpy(comm_bit_name::buf + sVar3 + 5,"hannels",8);
    uVar2 = (uint)*comm_flags;
  }
  if ((uVar2 >> 10 & 1) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," col",4);
    builtin_strncpy(comm_bit_name::buf + sVar3 + 3,"lor",4);
    uVar2 = (uint)*comm_flags;
  }
  if ((uVar2 >> 0x1c & 1) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," switchs",8);
    builtin_strncpy(comm_bit_name::buf + sVar3 + 6,"hskills",8);
    uVar2 = (uint)*comm_flags;
  }
  if ((uVar2 >> 0x1e & 1) != 0) {
    sVar3 = strlen(comm_bit_name::buf);
    builtin_strncpy(comm_bit_name::buf + sVar3," lots o ",8);
    builtin_strncpy(comm_bit_name::buf + sVar3 + 7," color!",8);
  }
  pcVar1 = comm_bit_name::buf;
  if (comm_bit_name::buf[0] == '\0') {
    pcVar1 = " none";
  }
  return pcVar1 + 1;
}

Assistant:

char *comm_bit_name(long comm_flags[])
{
	static char buf[512];

	buf[0] = '\0';

	if (IS_SET(comm_flags, COMM_QUIET))
		strcat(buf, " quiet");

	if (IS_SET(comm_flags, COMM_DEAF))
		strcat(buf, " deaf");

	if (IS_SET(comm_flags, COMM_NOWIZ))
		strcat(buf, " no_wiz");

	if (IS_SET(comm_flags, COMM_NOAUCTION))
		strcat(buf, " no_auction");

	if (IS_SET(comm_flags, COMM_NOGOSSIP))
		strcat(buf, " no_gossip");

	if (IS_SET(comm_flags, COMM_NOQUESTION))
		strcat(buf, " no_question");

	if (IS_SET(comm_flags, COMM_NONEWBIE))
		strcat(buf, " no_newbie");

	if (IS_SET(comm_flags, COMM_NOQUOTE))
		strcat(buf, " no_quote");

	if (IS_SET(comm_flags, COMM_COMPACT))
		strcat(buf, " compact");

	if (IS_SET(comm_flags, COMM_BRIEF))
		strcat(buf, " brief");

	if (IS_SET(comm_flags, COMM_PROMPT))
		strcat(buf, " prompt");

	if (IS_SET(comm_flags, COMM_COMBINE))
		strcat(buf, " combine");

	if (IS_SET(comm_flags, COMM_NOEMOTE))
		strcat(buf, " no_emote");

	if (IS_SET(comm_flags, COMM_NOSHOUT))
		strcat(buf, " no_shout");

	if (IS_SET(comm_flags, COMM_NOTELL))
		strcat(buf, " no_tell");

	if (IS_SET(comm_flags, COMM_NOCHANNELS))
		strcat(buf, " no_channels");

	if (IS_SET(comm_flags, COMM_ANSI))
		strcat(buf, " color");

	if (IS_SET(comm_flags, COMM_SWITCHSKILLS))
		strcat(buf, " switchskills");

	if (IS_SET(comm_flags, COMM_LOTS_O_COLOR))
		strcat(buf, " lots o color!");

	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}